

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3VdbeHalt(Vdbe *p)

{
  u8 uVar1;
  VdbeFrame *pVVar2;
  VTable **ppVVar3;
  sqlite3_vtab *psVar4;
  _func_int_sqlite3_vtab_ptr *p_Var5;
  Btree *pBVar6;
  Pager *pPVar7;
  sqlite3_vfs *pVfs;
  BtShared *pBVar8;
  char *z;
  bool bVar9;
  sqlite3_file *pFile;
  byte bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  VdbeFrame *pFrame;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  BtShared *pBt;
  sqlite3 *db;
  int i;
  long lVar19;
  long lVar20;
  bool bVar21;
  uint local_58;
  int res;
  sqlite3_file *pMaster;
  long local_48;
  long local_40;
  sqlite3 *local_38;
  
  db = p->db;
  if (db->mallocFailed != '\0') {
    p->rc = 7;
  }
  if (p->aOnceFlag != (u8 *)0x0) {
    memset(p->aOnceFlag,0,(long)p->nOnceFlag);
  }
  pVVar2 = p->pFrame;
  if (p->pFrame != (VdbeFrame *)0x0) {
    do {
      pFrame = pVVar2;
      pVVar2 = pFrame->pParent;
    } while (pVVar2 != (VdbeFrame *)0x0);
    sqlite3VdbeFrameRestore(pFrame);
  }
  p->pFrame = (VdbeFrame *)0x0;
  p->nFrame = 0;
  if (p->apCsr != (VdbeCursor **)0x0) {
    for (lVar19 = 0; lVar19 < p->nCursor; lVar19 = lVar19 + 1) {
      if (p->apCsr[lVar19] != (VdbeCursor *)0x0) {
        sqlite3VdbeFreeCursor(p,p->apCsr[lVar19]);
        p->apCsr[lVar19] = (VdbeCursor *)0x0;
      }
    }
  }
  if (p->aMem != (Mem *)0x0) {
    releaseMemArray(p->aMem + 1,p->nMem);
  }
  while (pVVar2 = p->pDelFrame, pVVar2 != (VdbeFrame *)0x0) {
    p->pDelFrame = pVVar2->pParent;
    iVar17 = pVVar2->nChildMem;
    for (lVar19 = 0; lVar19 < pVVar2->nChildCsr; lVar19 = lVar19 + 1) {
      sqlite3VdbeFreeCursor(pVVar2->v,(VdbeCursor *)(&pVVar2[1].v)[(long)iVar17 * 7 + lVar19]);
    }
    releaseMemArray((Mem *)(pVVar2 + 1),pVVar2->nChildMem);
    sqlite3DbFree(pVVar2->v->db,pVVar2);
  }
  if (p->magic != 0xbdf20da3) {
    return 0;
  }
  if (p->pc < 0) goto LAB_0014b3c7;
  sqlite3VdbeEnter(p);
  uVar13 = p->rc;
  bVar9 = false;
  bVar21 = true;
  bVar10 = (byte)uVar13;
  if ((bVar10 < 0xe) && ((0x2680U >> (uVar13 & 0x1f) & 1) != 0)) {
    if ((bVar10 == 9 & (byte)((ushort)*(undefined2 *)&p->field_0x9a >> 8) & 1) == 0) {
      if (((bVar10 == 0xd) || ((uVar13 & 0xff) == 7)) &&
         ((char)*(undefined2 *)&p->field_0x9a < '\0')) {
        iVar17 = 2;
        bVar9 = true;
        bVar21 = false;
      }
      else {
        sqlite3RollbackAll(db,0x204);
        sqlite3CloseSavepoints(db);
        db->autoCommit = '\x01';
        uVar13 = p->rc;
        iVar17 = 0;
        bVar9 = true;
        bVar21 = true;
      }
      goto LAB_0014aef6;
    }
    bVar21 = true;
    iVar17 = 0;
    bVar9 = true;
  }
  else {
    iVar17 = 0;
LAB_0014aef6:
    if (uVar13 == 0) {
      sqlite3VdbeCheckFk(p,0);
    }
  }
  if (((db->nVTrans < 1) || (db->aVTrans != (VTable **)0x0)) &&
     ((db->autoCommit != '\0' && (db->writeVdbeCnt == (uint)((p->field_0x9b & 1) == 0))))) {
    if ((p->rc == 0) || (!bVar9 && p->errorAction == '\x03')) {
      iVar11 = sqlite3VdbeCheckFk(p,1);
      if (iVar11 == 0) {
        ppVVar3 = db->aVTrans;
        db->aVTrans = (VTable **)0x0;
        iVar11 = 0;
        for (lVar19 = 0; (iVar11 == 0 && (lVar19 < db->nVTrans)); lVar19 = lVar19 + 1) {
          psVar4 = ppVVar3[lVar19]->pVtab;
          iVar11 = 0;
          if ((psVar4 != (sqlite3_vtab *)0x0) &&
             (p_Var5 = psVar4->pModule->xSync, p_Var5 != (_func_int_sqlite3_vtab_ptr *)0x0)) {
            iVar11 = (*p_Var5)(psVar4);
            sqlite3DbFree(db,p->zErrMsg);
            pcVar14 = sqlite3DbStrDup(db,psVar4->zErrMsg);
            p->zErrMsg = pcVar14;
            sqlite3_free(psVar4->zErrMsg);
          }
        }
        db->aVTrans = ppVVar3;
        lVar19 = 0;
        lVar18 = 0;
        bVar21 = false;
        iVar15 = 0;
        local_38 = db;
LAB_0014b065:
        if (iVar11 == 0) {
          if (lVar18 < db->nDb) goto code_r0x0014b077;
          if ((bVar21) && (db->xCommitCallback != (_func_int_void_ptr *)0x0)) {
            iVar12 = (*db->xCommitCallback)(db->pCommitArg);
            iVar11 = 0x213;
            if (iVar12 != 0) goto LAB_0014b301;
          }
          pPVar7 = db->aDb->pBt->pBt->pPager;
          uVar1 = pPVar7->memDb;
          if (uVar1 == '\0') {
            pcVar14 = pPVar7->zFilename;
          }
          else {
            pcVar14 = "";
          }
          iVar11 = sqlite3Strlen30(pcVar14);
          if ((iVar11 == 0) || (iVar15 < 2)) {
            lVar19 = 8;
            iVar11 = 0;
            for (lVar18 = 0; (iVar11 == 0 && (lVar18 < db->nDb)); lVar18 = lVar18 + 1) {
              pBVar6 = *(Btree **)((long)&db->aDb->zName + lVar19);
              if (pBVar6 == (Btree *)0x0) {
                iVar11 = 0;
              }
              else {
                iVar11 = sqlite3BtreeCommitPhaseOne(pBVar6,(char *)0x0);
              }
              lVar19 = lVar19 + 0x20;
            }
            lVar19 = 8;
            lVar18 = 0;
            while (iVar11 == 0) {
              if (db->nDb <= lVar18) goto LAB_0014b624;
              pBVar6 = *(Btree **)((long)&db->aDb->zName + lVar19);
              if (pBVar6 == (Btree *)0x0) {
                iVar11 = 0;
              }
              else {
                iVar11 = sqlite3BtreeCommitPhaseTwo(pBVar6,0);
              }
              lVar18 = lVar18 + 1;
              lVar19 = lVar19 + 0x20;
            }
            goto LAB_0014b2e5;
          }
          if (uVar1 == '\0') {
            pcVar14 = pPVar7->zFilename;
          }
          else {
            pcVar14 = "";
          }
          pVfs = db->pVfs;
          pMaster = (sqlite3_file *)0x0;
          uVar13 = sqlite3Strlen30(pcVar14);
          pcVar14 = sqlite3MPrintf(db,"%s-mjXXXXXX9XXz",pcVar14);
          if (pcVar14 != (char *)0x0) {
            uVar16 = 0;
            goto LAB_0014b212;
          }
          iVar11 = 7;
        }
        goto LAB_0014b2e5;
      }
      iVar11 = 0x313;
      if ((p->field_0x9b & 1) != 0) {
        sqlite3VdbeLeave(p);
        return 1;
      }
      goto LAB_0014b301;
    }
    goto LAB_0014b308;
  }
  if (!bVar21) goto LAB_0014b31a;
  iVar17 = 1;
  if ((p->rc == 0) || (p->errorAction == '\x03')) goto LAB_0014b31f;
  if (p->errorAction == '\x02') {
    iVar17 = 2;
    goto LAB_0014b31f;
  }
  sqlite3RollbackAll(db,0x204);
  sqlite3CloseSavepoints(db);
  iVar17 = 0;
LAB_0014b36f:
  db->autoCommit = '\x01';
  goto LAB_0014b379;
code_r0x0014b077:
  pBVar6 = *(Btree **)((long)&db->aDb->pBt + lVar19);
  iVar11 = 0;
  if ((pBVar6 != (Btree *)0x0) && (pBVar6->inTrans == '\x02')) {
    iVar15 = iVar15 + (uint)(lVar18 != 1);
    sqlite3BtreeEnter(pBVar6);
    iVar11 = sqlite3PagerExclusiveLock(pBVar6->pBt->pPager);
    sqlite3BtreeLeave(pBVar6);
    bVar21 = true;
    db = local_38;
  }
  lVar18 = lVar18 + 1;
  lVar19 = lVar19 + 0x20;
  goto LAB_0014b065;
code_r0x0014b56b:
  pBVar6 = *(Btree **)((long)&db->aDb->zName + lVar19);
  if (pBVar6 == (Btree *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar11 = sqlite3BtreeCommitPhaseOne(pBVar6,pcVar14);
  }
  lVar18 = lVar18 + 1;
  lVar19 = lVar19 + 0x20;
  goto LAB_0014b55d;
  while( true ) {
    sqlite3_randomness(4,&local_58);
    sqlite3_snprintf(0xd,pcVar14 + uVar13,"-mj%06X9%02X",(ulong)(local_58 >> 8));
    iVar11 = (*pVfs->xAccess)(pVfs,pcVar14,0,&res);
    if ((iVar11 != 0) || (uVar16 = uVar16 + 1, res == 0)) break;
LAB_0014b212:
    if (uVar16 != 0) {
      if (100 < uVar16) {
        sqlite3_log(0xd,"MJ delete: %s",pcVar14);
        (*pVfs->xDelete)(pVfs,pcVar14,0);
        goto LAB_0014b2b3;
      }
      if (uVar16 == 1) {
        sqlite3_log(0xd,"MJ collide: %s",pcVar14);
      }
    }
  }
  if (iVar11 == 0) {
LAB_0014b2b3:
    iVar11 = sqlite3OsOpenMalloc(pVfs,pcVar14,&pMaster,0x4016,(int *)0x0);
    pFile = pMaster;
    if (iVar11 == 0) {
      bVar21 = false;
      lVar18 = 0;
      lVar19 = 8;
      for (lVar20 = 0; lVar20 < db->nDb; lVar20 = lVar20 + 1) {
        pBVar6 = *(Btree **)((long)&db->aDb->zName + lVar19);
        if ((pBVar6 != (Btree *)0x0) && (pBVar6->inTrans == '\x02')) {
          pBVar8 = pBVar6->pBt;
          z = pBVar8->pPager->zJournal;
          if (z != (char *)0x0) {
            bVar9 = !bVar21;
            bVar21 = true;
            local_48 = lVar19;
            local_40 = lVar18;
            if (bVar9) {
              sqlite3BtreeEnter(pBVar6);
              bVar21 = pBVar8->pPager->noSync == '\0';
              sqlite3BtreeLeave(pBVar6);
            }
            iVar11 = sqlite3Strlen30(z);
            lVar19 = local_40;
            iVar11 = (*pFile->pMethods->xWrite)(pFile,z,iVar11 + 1,local_40);
            uVar13 = sqlite3Strlen30(z);
            if (iVar11 != 0) goto LAB_0014b535;
            lVar18 = (ulong)uVar13 + lVar19 + 1;
            lVar19 = local_48;
          }
        }
        lVar19 = lVar19 + 0x20;
      }
      if (((bVar21) &&
          (uVar13 = (*pFile->pMethods->xDeviceCharacteristics)(pFile), (uVar13 >> 10 & 1) == 0)) &&
         (iVar11 = (*pFile->pMethods->xSync)(pFile,2), iVar11 != 0)) {
LAB_0014b535:
        sqlite3OsCloseFree(pFile);
        (*pVfs->xDelete)(pVfs,pcVar14,0);
      }
      else {
        lVar18 = 0;
        lVar19 = 8;
        iVar11 = 0;
LAB_0014b55d:
        if (iVar11 == 0) {
          if (lVar18 < db->nDb) goto code_r0x0014b56b;
          sqlite3OsCloseFree(pFile);
          iVar11 = (*pVfs->xDelete)(pVfs,pcVar14,1);
          sqlite3DbFree(db,pcVar14);
          if (iVar11 == 0) {
            if (sqlite3Hooks_0 != (code *)0x0) {
              (*sqlite3Hooks_0)();
            }
            lVar19 = 8;
            for (lVar18 = 0; lVar18 < db->nDb; lVar18 = lVar18 + 1) {
              pBVar6 = *(Btree **)((long)&db->aDb->zName + lVar19);
              if (pBVar6 != (Btree *)0x0) {
                sqlite3BtreeCommitPhaseTwo(pBVar6,1);
              }
              lVar19 = lVar19 + 0x20;
            }
            if (sqlite3Hooks_1 != (code *)0x0) {
              (*sqlite3Hooks_1)();
            }
LAB_0014b624:
            sqlite3VtabCommit(db);
            db->nDeferredCons = 0;
            *(byte *)&db->flags = (byte)db->flags & 0xfd;
            goto LAB_0014b312;
          }
          goto LAB_0014b2e5;
        }
        sqlite3OsCloseFree(pFile);
      }
    }
  }
  sqlite3DbFree(db,pcVar14);
LAB_0014b2e5:
  if (iVar11 == 5) {
    if ((p->field_0x9b & 1) != 0) {
      sqlite3VdbeLeave(p);
      return 5;
    }
    iVar11 = 5;
  }
LAB_0014b301:
  p->rc = iVar11;
LAB_0014b308:
  sqlite3RollbackAll(db,0);
LAB_0014b312:
  db->nStatement = 0;
LAB_0014b31a:
  if (iVar17 == 0) {
    iVar17 = 0;
  }
  else {
LAB_0014b31f:
    iVar11 = sqlite3VdbeCloseStatement(p,iVar17);
    if (iVar11 != 0) {
      if (p->rc == 0 || (char)p->rc == '\x13') {
        p->rc = iVar11;
        sqlite3DbFree(db,p->zErrMsg);
        p->zErrMsg = (char *)0x0;
      }
      sqlite3RollbackAll(db,0x204);
      sqlite3CloseSavepoints(db);
      goto LAB_0014b36f;
    }
  }
LAB_0014b379:
  if ((p->field_0x9a & 0x10) != 0) {
    iVar11 = 0;
    if (iVar17 != 2) {
      iVar11 = p->nChange;
      db->nTotalChange = db->nTotalChange + iVar11;
    }
    db->nChange = iVar11;
    p->nChange = 0;
  }
  sqlite3VdbeLeave(p);
  if ((-1 < p->pc) && (db->activeVdbeCnt = db->activeVdbeCnt + -1, (p->field_0x9b & 1) == 0)) {
    db->writeVdbeCnt = db->writeVdbeCnt + -1;
  }
LAB_0014b3c7:
  p->magic = 0x519c2973;
  if (p->db->mallocFailed == '\0') {
    iVar17 = (uint)(p->rc == 5) * 5;
  }
  else {
    p->rc = 7;
    iVar17 = 0;
  }
  return iVar17;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeHalt(Vdbe *p){
  int rc;                         /* Used to store transient return codes */
  sqlite3 *db = p->db;

  /* This function contains the logic that determines if a statement or
  ** transaction will be committed or rolled back as a result of the
  ** execution of this virtual machine. 
  **
  ** If any of the following errors occur:
  **
  **     SQLITE_NOMEM
  **     SQLITE_IOERR
  **     SQLITE_FULL
  **     SQLITE_INTERRUPT
  **
  ** Then the internal cache might have been left in an inconsistent
  ** state.  We need to rollback the statement transaction, if there is
  ** one, or the complete transaction if there is no statement transaction.
  */

  if( p->db->mallocFailed ){
    p->rc = SQLITE_NOMEM;
  }
  if( p->aOnceFlag ) memset(p->aOnceFlag, 0, p->nOnceFlag);
  closeAllCursors(p);
  if( p->magic!=VDBE_MAGIC_RUN ){
    return SQLITE_OK;
  }
  checkActiveVdbeCnt(db);

  /* No commit or rollback needed if the program never started */
  if( p->pc>=0 ){
    int mrc;   /* Primary error code from p->rc */
    int eStatementOp = 0;
    int isSpecialError;            /* Set to true if a 'special' error */

    /* Lock all btrees used by the statement */
    sqlite3VdbeEnter(p);

    /* Check for one of the special errors */
    mrc = p->rc & 0xff;
    assert( p->rc!=SQLITE_IOERR_BLOCKED );  /* This error no longer exists */
    isSpecialError = mrc==SQLITE_NOMEM || mrc==SQLITE_IOERR
                     || mrc==SQLITE_INTERRUPT || mrc==SQLITE_FULL;
    if( isSpecialError ){
      /* If the query was read-only and the error code is SQLITE_INTERRUPT, 
      ** no rollback is necessary. Otherwise, at least a savepoint 
      ** transaction must be rolled back to restore the database to a 
      ** consistent state.
      **
      ** Even if the statement is read-only, it is important to perform
      ** a statement or transaction rollback operation. If the error 
      ** occurred while writing to the journal, sub-journal or database
      ** file as part of an effort to free up cache space (see function
      ** pagerStress() in pager.c), the rollback is required to restore 
      ** the pager to a consistent state.
      */
      if( !p->readOnly || mrc!=SQLITE_INTERRUPT ){
        if( (mrc==SQLITE_NOMEM || mrc==SQLITE_FULL) && p->usesStmtJournal ){
          eStatementOp = SAVEPOINT_ROLLBACK;
        }else{
          /* We are forced to roll back the active transaction. Before doing
          ** so, abort any other statements this handle currently has active.
          */
          sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
          sqlite3CloseSavepoints(db);
          db->autoCommit = 1;
        }
      }
    }

    /* Check for immediate foreign key violations. */
    if( p->rc==SQLITE_OK ){
      sqlite3VdbeCheckFk(p, 0);
    }
  
    /* If the auto-commit flag is set and this is the only active writer 
    ** VM, then we do either a commit or rollback of the current transaction. 
    **
    ** Note: This block also runs if one of the special errors handled 
    ** above has occurred. 
    */
    if( !sqlite3VtabInSync(db) 
     && db->autoCommit 
     && db->writeVdbeCnt==(p->readOnly==0) 
    ){
      if( p->rc==SQLITE_OK || (p->errorAction==OE_Fail && !isSpecialError) ){
        rc = sqlite3VdbeCheckFk(p, 1);
        if( rc!=SQLITE_OK ){
          if( NEVER(p->readOnly) ){
            sqlite3VdbeLeave(p);
            return SQLITE_ERROR;
          }
          rc = SQLITE_CONSTRAINT_FOREIGNKEY;
        }else{ 
          /* The auto-commit flag is true, the vdbe program was successful 
          ** or hit an 'OR FAIL' constraint and there are no deferred foreign
          ** key constraints to hold up the transaction. This means a commit 
          ** is required. */
          rc = vdbeCommit(db, p);
        }
        if( rc==SQLITE_BUSY && p->readOnly ){
          sqlite3VdbeLeave(p);
          return SQLITE_BUSY;
        }else if( rc!=SQLITE_OK ){
          p->rc = rc;
          sqlite3RollbackAll(db, SQLITE_OK);
        }else{
          db->nDeferredCons = 0;
          sqlite3CommitInternalChanges(db);
        }
      }else{
        sqlite3RollbackAll(db, SQLITE_OK);
      }
      db->nStatement = 0;
    }else if( eStatementOp==0 ){
      if( p->rc==SQLITE_OK || p->errorAction==OE_Fail ){
        eStatementOp = SAVEPOINT_RELEASE;
      }else if( p->errorAction==OE_Abort ){
        eStatementOp = SAVEPOINT_ROLLBACK;
      }else{
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
      }
    }
  
    /* If eStatementOp is non-zero, then a statement transaction needs to
    ** be committed or rolled back. Call sqlite3VdbeCloseStatement() to
    ** do so. If this operation returns an error, and the current statement
    ** error code is SQLITE_OK or SQLITE_CONSTRAINT, then promote the
    ** current statement error code.
    */
    if( eStatementOp ){
      rc = sqlite3VdbeCloseStatement(p, eStatementOp);
      if( rc ){
        if( p->rc==SQLITE_OK || (p->rc&0xff)==SQLITE_CONSTRAINT ){
          p->rc = rc;
          sqlite3DbFree(db, p->zErrMsg);
          p->zErrMsg = 0;
        }
        sqlite3RollbackAll(db, SQLITE_ABORT_ROLLBACK);
        sqlite3CloseSavepoints(db);
        db->autoCommit = 1;
      }
    }
  
    /* If this was an INSERT, UPDATE or DELETE and no statement transaction
    ** has been rolled back, update the database connection change-counter. 
    */
    if( p->changeCntOn ){
      if( eStatementOp!=SAVEPOINT_ROLLBACK ){
        sqlite3VdbeSetChanges(db, p->nChange);
      }else{
        sqlite3VdbeSetChanges(db, 0);
      }
      p->nChange = 0;
    }

    /* Release the locks */
    sqlite3VdbeLeave(p);
  }

  /* We have successfully halted and closed the VM.  Record this fact. */
  if( p->pc>=0 ){
    db->activeVdbeCnt--;
    if( !p->readOnly ){
      db->writeVdbeCnt--;
    }
    assert( db->activeVdbeCnt>=db->writeVdbeCnt );
  }
  p->magic = VDBE_MAGIC_HALT;
  checkActiveVdbeCnt(db);
  if( p->db->mallocFailed ){
    p->rc = SQLITE_NOMEM;
  }

  /* If the auto-commit flag is set to true, then any locks that were held
  ** by connection db have now been released. Call sqlite3ConnectionUnlocked() 
  ** to invoke any required unlock-notify callbacks.
  */
  if( db->autoCommit ){
    sqlite3ConnectionUnlocked(db);
  }

  assert( db->activeVdbeCnt>0 || db->autoCommit==0 || db->nStatement==0 );
  return (p->rc==SQLITE_BUSY ? SQLITE_BUSY : SQLITE_OK);
}